

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_cell_with(REF_GRID ref_grid,REF_INT node_per,REF_CELL *ref_cell)

{
  REF_STATUS ref_private_macro_code_rss;
  REF_CELL *ref_cell_local;
  REF_INT node_per_local;
  REF_GRID ref_grid_local;
  
  *ref_cell = (REF_CELL)0x0;
  switch(node_per) {
  case 4:
    *ref_cell = ref_grid->cell[8];
    break;
  case 5:
    *ref_cell = ref_grid->cell[9];
    break;
  case 6:
    *ref_cell = ref_grid->cell[10];
    break;
  default:
    printf("node_per %d\n",(ulong)(uint)node_per);
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",299,
           "ref_grid_cell_with",1,"unexpected node_per");
    return 1;
  case 8:
    *ref_cell = ref_grid->cell[0xb];
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_grid_cell_with(REF_GRID ref_grid, REF_INT node_per,
                                      REF_CELL *ref_cell) {
  *ref_cell = NULL;

  switch (node_per) {
    case 4:
      *ref_cell = ref_grid_tet(ref_grid);
      break;
    case 5:
      *ref_cell = ref_grid_pyr(ref_grid);
      break;
    case 6:
      *ref_cell = ref_grid_pri(ref_grid);
      break;
    case 8:
      *ref_cell = ref_grid_hex(ref_grid);
      break;
    default:
      printf("node_per %d\n", node_per);
      RSS(REF_FAILURE, "unexpected node_per");
      break;
  }

  return REF_SUCCESS;
}